

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 07_minimum_duration.cpp
# Opt level: O2

int main(void)

{
  Result RVar1;
  ostream *poVar2;
  undefined8 uVar3;
  OutputParameter<3UL,_ruckig::StandardVector> output;
  Ruckig<3UL,_ruckig::StandardVector,_false> otg;
  string sStack_1d78;
  InputParameter<3UL,_ruckig::StandardVector> local_1d58;
  undefined1 local_1a88 [296];
  double local_1960;
  Ruckig<3UL,_ruckig::StandardVector,_false> local_1940;
  
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::Ruckig<3UL,_0>(&local_1940,0.01);
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::InputParameter<3UL,_0>(&local_1d58);
  ruckig::OutputParameter<3UL,_ruckig::StandardVector>::OutputParameter<3UL,_0>
            ((OutputParameter<3UL,_ruckig::StandardVector> *)local_1a88);
  local_1d58.current_position._M_elems[0] = 0.0;
  local_1d58.current_position._M_elems[1] = 0.0;
  local_1d58.current_position._M_elems[2] = 0.5;
  local_1d58.current_velocity._M_elems[0] = 0.0;
  local_1d58.current_velocity._M_elems[1] = -2.2;
  local_1d58.current_velocity._M_elems[2] = -0.5;
  local_1d58.current_acceleration._M_elems[0] = 0.0;
  local_1d58.current_acceleration._M_elems[1] = 2.5;
  local_1d58.current_acceleration._M_elems[2] = -0.5;
  local_1d58.target_position._M_elems[0] = -5.0;
  local_1d58.target_position._M_elems[1] = -2.0;
  local_1d58.target_position._M_elems[2] = -3.5;
  local_1d58.target_velocity._M_elems[0] = 0.0;
  local_1d58.target_velocity._M_elems[1] = -0.5;
  uVar3 = 0;
  local_1d58.target_velocity._M_elems[2] = -2.0;
  local_1d58.target_acceleration._M_elems[2] = 0.5;
  local_1d58.target_acceleration._M_elems[0] = 0.0;
  local_1d58.target_acceleration._M_elems[1] = 0.0;
  local_1d58.max_velocity._M_elems[2] = 3.0;
  local_1d58.max_velocity._M_elems[0] = 3.0;
  local_1d58.max_velocity._M_elems[1] = 1.0;
  local_1d58.max_acceleration._M_elems[2] = 1.0;
  local_1d58.max_acceleration._M_elems[0] = 3.0;
  local_1d58.max_acceleration._M_elems[1] = 2.0;
  local_1d58.max_jerk._M_elems[2] = 2.0;
  local_1d58.max_jerk._M_elems[0] = 4.0;
  local_1d58.max_jerk._M_elems[1] = 3.0;
  local_1d58.minimum_duration.super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_payload._M_value = 5.0;
  local_1d58.minimum_duration.super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_engaged = true;
  poVar2 = std::operator<<((ostream *)&std::cout,"t | position");
  std::endl<char,std::char_traits<char>>(poVar2);
  while( true ) {
    RVar1 = ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::update
                      (&local_1940,&local_1d58,
                       (OutputParameter<3UL,_ruckig::StandardVector> *)local_1a88);
    if (RVar1 != Working) break;
    poVar2 = std::ostream::_M_insert<double>(local_1960);
    poVar2 = std::operator<<(poVar2," | ");
    ruckig::join<std::array<double,3ul>>
              (&sStack_1d78,(ruckig *)(local_1a88 + 200),(array<double,_3UL> *)0x0,SUB81(uVar3,0));
    poVar2 = std::operator<<(poVar2,(string *)&sStack_1d78);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&sStack_1d78);
    ruckig::OutputParameter<3UL,_ruckig::StandardVector>::pass_to_input
              ((OutputParameter<3UL,_ruckig::StandardVector> *)local_1a88,&local_1d58);
  }
  std::operator<<((ostream *)&std::cout,"Trajectory duration: ");
  poVar2 = std::ostream::_M_insert<double>((double)local_1a88._32_8_);
  poVar2 = std::operator<<(poVar2," [s].");
  std::endl<char,std::char_traits<char>>(poVar2);
  ruckig::Trajectory<3UL,_ruckig::StandardVector>::~Trajectory
            ((Trajectory<3UL,_ruckig::StandardVector> *)(local_1a88 + 8));
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter(&local_1d58);
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::~Ruckig(&local_1940);
  return 0;
}

Assistant:

int main() {
    // Create instances: the Ruckig OTG as well as input and output parameters
    Ruckig<3> otg(0.01);  // control cycle
    InputParameter<3> input;
    OutputParameter<3> output;

    // Set input parameters
    input.current_position = {0.0, 0.0, 0.5};
    input.current_velocity = {0.0, -2.2, -0.5};
    input.current_acceleration = {0.0, 2.5, -0.5};

    input.target_position = {-5.0, -2.0, -3.5};
    input.target_velocity = {0.0, -0.5, -2.0};
    input.target_acceleration = {0.0, 0.0, 0.5};

    input.max_velocity = {3.0, 1.0, 3.0};
    input.max_acceleration = {3.0, 2.0, 1.0};
    input.max_jerk = {4.0, 3.0, 2.0};

    // Set minimum duration (equals the trajectory duration when target velocity and acceleration are zero)
    input.minimum_duration = 5.0;

    // Generate the trajectory within the control loop
    std::cout << "t | position" << std::endl;
    while (otg.update(input, output) == Result::Working) {
        std::cout << output.time << " | " << join(output.new_position) << std::endl;

        output.pass_to_input(input);
    }

    std::cout << "Trajectory duration: " << output.trajectory.get_duration() << " [s]." << std::endl;
}